

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

uint32 __thiscall
TTD::UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL>::Count
          (UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL> *this)

{
  ulong uVar1;
  size_t ncount;
  UnorderedArrayListLink *curr;
  size_t count;
  UnorderedArrayList<TTD::NSSnapType::SnapHandler,_2048UL> *this_local;
  
  curr = (UnorderedArrayListLink *)
         ((ulong)((long)(this->m_inlineHeadBlock).CurrPos -
                 (long)(this->m_inlineHeadBlock).BlockData) / 0x28);
  if ((UnorderedArrayListLink *)0x800 < curr) {
    TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
  }
  ncount = (size_t)(this->m_inlineHeadBlock).Next;
  while( true ) {
    if (ncount == 0) {
      return (uint32)curr;
    }
    uVar1 = (ulong)(*(long *)ncount - *(long *)(ncount + 0x10)) / 0x28;
    if (0x800 < uVar1) break;
    curr = (UnorderedArrayListLink *)((long)&curr->CurrPos + uVar1);
    ncount = *(size_t *)(ncount + 0x18);
  }
  TTDAbort_unrecoverable_error("We somehow wrote in too much data.");
}

Assistant:

uint32 Count() const
        {
            size_t count = (((byte*)this->m_inlineHeadBlock.CurrPos) - ((byte*)this->m_inlineHeadBlock.BlockData)) / sizeof(T);
            TTDAssert(count <= allocSize, "We somehow wrote in too much data.");

            for (UnorderedArrayListLink* curr = this->m_inlineHeadBlock.Next; curr != nullptr; curr = curr->Next)
            {
                size_t ncount = (((byte*)curr->CurrPos) - ((byte*)curr->BlockData)) / sizeof(T);
                TTDAssert(ncount <= allocSize, "We somehow wrote in too much data.");

                count += ncount;
            }

            return (uint32)count;
        }